

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

string * __thiscall
ApprovalTests::Path::removeRedundantDirectorySeparators
          (string *__return_storage_ptr__,Path *this,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  int iVar5;
  bool bVar6;
  string reducePath;
  undefined1 *local_f8;
  size_t local_f0;
  undefined1 local_e8 [16];
  string local_d8;
  string *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  paVar2 = &local_b0.field_2;
  local_b8 = __return_storage_ptr__;
  do {
    local_f8 = local_e8;
    pcVar3 = (path->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar3,pcVar3 + path->_M_string_length);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_f8,local_f8 + local_f0);
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"//","");
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/","");
    StringUtils::replaceAll(&local_50,&local_90,&local_b0,&local_d8);
    ::std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_f8,local_f8 + local_f0);
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"\\\\","");
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"\\","");
    StringUtils::replaceAll(&local_50,&local_70,&local_b0,&local_d8);
    ::std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    bVar6 = true;
    if (local_f0 == path->_M_string_length) {
      if (local_f0 == 0) {
        bVar6 = false;
      }
      else {
        iVar5 = bcmp(local_f8,(path->_M_dataplus)._M_p,local_f0);
        bVar6 = iVar5 != 0;
      }
    }
    ::std::__cxx11::string::_M_assign((string *)path);
    if (local_f8 != local_e8) {
      operator_delete(local_f8);
    }
  } while (bVar6);
  (local_b8->_M_dataplus)._M_p = (pointer)&local_b8->field_2;
  pcVar3 = (path->_M_dataplus)._M_p;
  paVar1 = &path->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&path->field_2 + 8);
    (local_b8->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&local_b8->field_2 + 8) = uVar4;
  }
  else {
    (local_b8->_M_dataplus)._M_p = pcVar3;
    (local_b8->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_b8->_M_string_length = path->_M_string_length;
  (path->_M_dataplus)._M_p = (pointer)paVar1;
  path->_M_string_length = 0;
  (path->field_2)._M_local_buf[0] = '\0';
  return local_b8;
}

Assistant:

std::string Path::removeRedundantDirectorySeparators(std::string path) const
    {
        bool changed = true;
        while (changed)
        {
            std::string reducePath = path;
            reducePath = StringUtils::replaceAll(reducePath, "//", "/");
            reducePath = StringUtils::replaceAll(reducePath, "\\\\", "\\");
            changed = (reducePath != path);
            path = reducePath;
        };
        return path;
    }